

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
* __thiscall
ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>::
operator<<(ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>
           *this,uchar *obj)

{
  CSHA256 *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uchar local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = *obj;
  this_00 = *(CSHA256 **)(*(long *)(this + 8) + 8);
  AutoFile::write(*(AutoFile **)this_00[1].s,(int)&local_21,(void *)0x1,in_RCX);
  CSHA256::Write(this_00,&local_21,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
            *)this;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream& operator<<(const U& obj) { ::Serialize(*this, obj); return *this; }